

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O1

int main(void)

{
  ulong in_RAX;
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  char empty [1];
  undefined8 uStack_8;
  
  pbVar1 = &stack0x00000004;
  uStack_8 = in_RAX & 0xffffffffffffff;
  bVar2 = 0x61;
  lVar3 = 0;
  do {
    if (bVar2 != *(byte *)((long)&uStack_8 + lVar3 + 7)) {
      pbVar1 = (byte *)((long)&uStack_8 + lVar3 + 7);
      break;
    }
    bVar2 = "abcde"[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  if (bVar2 <= *pbVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcmp.c, line %d - %s\n"
           ,0x25,"strcmp( abcde, empty ) > 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde";
    char cmpabcd_[] = "abcd\xfc";
    char empty[] = "";
    TESTCASE( strcmp( abcde, cmpabcde ) == 0 );
    TESTCASE( strcmp( abcde, abcdx ) < 0 );
    TESTCASE( strcmp( abcdx, abcde ) > 0 );
    TESTCASE( strcmp( empty, abcde ) < 0 );
    TESTCASE( strcmp( abcde, empty ) > 0 );
    TESTCASE( strcmp( abcde, cmpabcd_ ) < 0 );
    return TEST_RESULTS;
}